

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O2

void __thiscall
crnlib::dxt1_endpoint_optimizer::compute_pca
          (dxt1_endpoint_optimizer *this,vec3F *axis,vec3F_array *norm_colors,vec3F *def)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  float *pfVar4;
  ulong uVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  float fVar13;
  float fVar15;
  double dVar14;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  double dVar22;
  double dVar23;
  
  pfVar4 = norm_colors->m_p->m_s + 1;
  dVar7 = 0.0;
  dVar8 = 0.0;
  dVar9 = 0.0;
  dVar10 = 0.0;
  dVar11 = 0.0;
  dVar12 = 0.0;
  for (uVar5 = 0; norm_colors->m_size != uVar5; uVar5 = uVar5 + 1) {
    fVar1 = ((vec<3U,_float> *)(pfVar4 + -1))->m_s[0];
    uVar2 = (this->m_unique_colors).m_p[uVar5].m_weight;
    fVar13 = (float)*(undefined8 *)pfVar4;
    fVar15 = (float)((ulong)*(undefined8 *)pfVar4 >> 0x20);
    if (uVar2 < 2) {
      dVar18 = (double)(fVar1 * fVar1);
      dVar19 = (double)(fVar1 * fVar13);
      dVar16 = (double)(fVar1 * fVar15);
      dVar17 = (double)(fVar13 * fVar15);
      dVar14 = (double)(fVar13 * fVar13);
      dVar20 = (double)(fVar15 * fVar15);
    }
    else {
      dVar20 = (double)uVar2;
      dVar18 = (double)(fVar1 * fVar1) * dVar20;
      dVar19 = (double)(fVar1 * fVar13) * dVar20;
      dVar16 = (double)(fVar1 * fVar15) * dVar20;
      dVar17 = (double)(fVar13 * fVar15) * dVar20;
      dVar14 = (double)(fVar13 * fVar13) * dVar20;
      dVar20 = (double)(fVar15 * fVar15) * dVar20;
    }
    dVar10 = dVar10 + dVar19;
    dVar9 = dVar9 + dVar18;
    dVar8 = dVar8 + dVar17;
    dVar7 = dVar7 + dVar16;
    dVar11 = dVar11 + dVar14;
    dVar12 = dVar12 + dVar20;
    pfVar4 = pfVar4 + 3;
  }
  dVar14 = 0.699999988079071;
  uVar2 = 0;
  dVar20 = 0.8999999761581421;
  dVar16 = 1.0;
  do {
    dVar19 = dVar16;
    dVar18 = dVar20;
    dVar17 = dVar14;
    dVar14 = dVar17;
    dVar20 = dVar18;
    dVar16 = dVar19;
    if (uVar2 == 8) break;
    dVar14 = dVar17 * dVar12 + dVar18 * dVar7 + dVar8 * dVar19;
    dVar16 = dVar17 * dVar7 + dVar18 * dVar9 + dVar19 * dVar10;
    dVar22 = dVar17 * dVar8 + dVar18 * dVar10 + dVar19 * dVar11;
    dVar20 = ABS(dVar16);
    if (ABS(dVar16) <= ABS(dVar22)) {
      dVar20 = ABS(dVar22);
    }
    if (dVar20 <= ABS(dVar14)) {
      dVar20 = ABS(dVar14);
    }
    dVar23 = 1.0 / dVar20;
    if (1e-10 < dVar20) {
      dVar14 = dVar14 * dVar23;
    }
    uVar3 = (uint)(1e-10 < dVar20);
    auVar21._0_8_ = CONCAT44((int)(uVar3 << 0x1f) >> 0x1f,(int)(uVar3 << 0x1f) >> 0x1f);
    auVar21._8_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
    auVar21._12_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
    dVar20 = (double)(~auVar21._0_8_ & (ulong)dVar16 | (ulong)(dVar23 * dVar16) & auVar21._0_8_);
    dVar16 = (double)(~auVar21._8_8_ & (ulong)dVar22 | (ulong)(dVar23 * dVar22) & auVar21._8_8_);
    uVar3 = uVar2 + 1;
    bVar6 = uVar2 < 3;
    uVar2 = uVar3;
  } while ((bVar6) ||
          (1e-08 <= (dVar17 - dVar14) * (dVar17 - dVar14) +
                    (dVar19 - dVar16) * (dVar19 - dVar16) + (dVar18 - dVar20) * (dVar18 - dVar20)));
  dVar7 = dVar14 * dVar14 + dVar20 * dVar20 + dVar16 * dVar16;
  if (1e-10 <= dVar7) {
    dVar7 = 1.0 / SQRT(dVar7);
    *(ulong *)axis->m_s = CONCAT44((float)(dVar16 * dVar7),(float)(dVar20 * dVar7));
    axis->m_s[2] = (float)(dVar14 * dVar7);
    return;
  }
  vec<3U,_float>::operator=(axis,def);
  return;
}

Assistant:

void dxt1_endpoint_optimizer::compute_pca(vec3F& axis, const vec3F_array& norm_colors, const vec3F& def)
    {
        double cov[6] = { 0, 0, 0, 0, 0, 0 };
        for (uint i = 0; i < norm_colors.size(); i++)
        {
            const vec3F& v = norm_colors[i];
            float r = v[0];
            float g = v[1];
            float b = v[2];
            if (m_unique_colors[i].m_weight > 1)
            {
                const double weight = m_unique_colors[i].m_weight;
                cov[0] += r * r * weight;
                cov[1] += r * g * weight;
                cov[2] += r * b * weight;
                cov[3] += g * g * weight;
                cov[4] += g * b * weight;
                cov[5] += b * b * weight;
            }
            else
            {
                cov[0] += r * r;
                cov[1] += r * g;
                cov[2] += r * b;
                cov[3] += g * g;
                cov[4] += g * b;
                cov[5] += b * b;
            }
        }
        double vfr = .9f;
        double vfg = 1.0f;
        double vfb = .7f;
        for (uint iter = 0; iter < 8; iter++)
        {
            double r = vfr * cov[0] + vfg * cov[1] + vfb * cov[2];
            double g = vfr * cov[1] + vfg * cov[3] + vfb * cov[4];
            double b = vfr * cov[2] + vfg * cov[4] + vfb * cov[5];
            double m = math::maximum(fabs(r), fabs(g), fabs(b));
            if (m > 1e-10)
            {
                m = 1.0f / m;
                r *= m;
                g *= m;
                b *= m;
            }
            double delta = math::square(vfr - r) + math::square(vfg - g) + math::square(vfb - b);
            vfr = r;
            vfg = g;
            vfb = b;
            if ((iter > 2) && (delta < 1e-8))
            {
                break;
            }
        }
        double len = vfr * vfr + vfg * vfg + vfb * vfb;
        if (len < 1e-10)
        {
            axis = def;
        }
        else
        {
            len = 1.0f / sqrt(len);
            axis.set(static_cast<float>(vfr * len), static_cast<float>(vfg * len), static_cast<float>(vfb * len));
        }
    }